

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O0

bool __thiscall
MT32Emu::MidiEventQueue::pushShortMessage
          (MidiEventQueue *this,Bit32u shortMessageData,Bit32u timestamp)

{
  uint uVar1;
  MidiEvent *pMVar2;
  bool bVar3;
  MidiEvent *newEvent;
  Bit32u newEndPosition;
  Bit32u timestamp_local;
  Bit32u shortMessageData_local;
  MidiEventQueue *this_local;
  
  uVar1 = this->endPosition + 1 & this->ringBufferMask;
  bVar3 = this->startPosition != uVar1;
  if (bVar3) {
    pMVar2 = this->ringBuffer + this->endPosition;
    (*this->sysexDataStorage->_vptr_SysexDataStorage[4])
              (this->sysexDataStorage,pMVar2->sysexData,(ulong)(pMVar2->field_1).sysexLength);
    pMVar2->sysexData = (Bit8u *)0x0;
    (pMVar2->field_1).sysexLength = shortMessageData;
    pMVar2->timestamp = timestamp;
    this->endPosition = uVar1;
  }
  return bVar3;
}

Assistant:

bool MidiEventQueue::pushShortMessage(Bit32u shortMessageData, Bit32u timestamp) {
	Bit32u newEndPosition = (endPosition + 1) & ringBufferMask;
	// If ring buffer is full, bail out.
	if (startPosition == newEndPosition) return false;
	volatile MidiEvent &newEvent = ringBuffer[endPosition];
	sysexDataStorage.dispose(newEvent.sysexData, newEvent.sysexLength);
	newEvent.sysexData = NULL;
	newEvent.shortMessageData = shortMessageData;
	newEvent.timestamp = timestamp;
	endPosition = newEndPosition;
	return true;
}